

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O2

CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
* __thiscall
absl::lts_20240722::internal_any_invocable::
CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
::operator=(CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
            *this,CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
                  *other)

{
  InvokerType<false,_void,_std::basic_string_view<char>,_google::protobuf::io::Printer::SourceLocation>
  *pIVar1;
  
  (*this->manager_)(dispose,&this->state_,&this->state_);
  this->manager_ = EmptyManager;
  this->invoker_ =
       (InvokerType<false,_void,_std::basic_string_view<char>,_google::protobuf::io::Printer::SourceLocation>
        *)0x0;
  (*other->manager_)(relocate_from_to,&other->state_,&this->state_);
  pIVar1 = other->invoker_;
  this->manager_ = other->manager_;
  this->invoker_ = pIVar1;
  other->manager_ = EmptyManager;
  other->invoker_ =
       (InvokerType<false,_void,_std::basic_string_view<char>,_google::protobuf::io::Printer::SourceLocation>
        *)0x0;
  return this;
}

Assistant:

CoreImpl& operator=(CoreImpl&& other) noexcept {
    // Put the left-hand operand in an empty state.
    //
    // Note: A full reset that leaves us with an object that has its invariants
    // intact is necessary in order to handle self-move. This is required by
    // types that are used with certain operations of the standard library, such
    // as the default definition of std::swap when both operands target the same
    // object.
    Clear();

    // Perform the actual move/destroy operation on the target function.
    other.manager_(FunctionToCall::relocate_from_to, &other.state_, &state_);
    manager_ = other.manager_;
    invoker_ = other.invoker_;
    other.manager_ = EmptyManager;
    other.invoker_ = nullptr;

    return *this;
  }